

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O1

int __thiscall deqp::gls::VertexArrayTest::init(VertexArrayTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  GLContext *this_00;
  ReferenceContextBuffers *this_01;
  undefined4 extraout_var_01;
  ReferenceContext *this_02;
  ContextArrayPack *pCVar3;
  int height;
  ReferenceContextLimits limits;
  PixelBufferAccess local_118;
  ReferenceContextLimits local_f0;
  MultisamplePixelBufferAccess local_98;
  MultisamplePixelBufferAccess local_70;
  MultisamplePixelBufferAccess local_48;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = *(int *)CONCAT44(extraout_var,iVar1);
  if (0x1ff < iVar1) {
    iVar1 = 0x200;
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)(CONCAT44(extraout_var_00,iVar2) + 4);
  height = 0x200;
  if (iVar2 < 0x200) {
    height = iVar2;
  }
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_f0,this->m_renderCtx);
  this_00 = (GLContext *)operator_new(0x170);
  local_118.super_ConstPixelBufferAccess.m_format.order = R;
  local_118.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_118.super_ConstPixelBufferAccess.m_size.m_data[0] = iVar1;
  local_118.super_ConstPixelBufferAccess.m_size.m_data[1] = height;
  sglr::GLContext::GLContext
            (this_00,this->m_renderCtx,((this->super_TestCase).super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_118);
  this->m_glesContext = (Context *)this_00;
  this_01 = (ReferenceContextBuffers *)operator_new(0x78);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (this_01,(PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8),0,0,iVar1,height,1);
  this->m_refBuffers = this_01;
  this_02 = (ReferenceContext *)operator_new(0x61b0);
  tcu::TextureLevel::getAccess(&local_118,(TextureLevel *)this_01);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  tcu::TextureLevel::getAccess(&local_118,&this->m_refBuffers->m_depthbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  tcu::TextureLevel::getAccess(&local_118,&this->m_refBuffers->m_stencilbuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_118);
  sglr::ReferenceContext::ReferenceContext(this_02,&local_f0,&local_48,&local_70,&local_98);
  this->m_refContext = this_02;
  pCVar3 = (ContextArrayPack *)operator_new(0x50);
  ContextArrayPack::ContextArrayPack(pCVar3,this->m_renderCtx,this->m_glesContext);
  this->m_glArrayPack = pCVar3;
  pCVar3 = (ContextArrayPack *)operator_new(0x50);
  ContextArrayPack::ContextArrayPack(pCVar3,this->m_renderCtx,&this->m_refContext->super_Context);
  this->m_rrArrayPack = pCVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.extensionStr._M_dataplus._M_p != &local_f0.extensionStr.field_2) {
    operator_delete(local_f0.extensionStr._M_dataplus._M_p,
                    local_f0.extensionStr.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.extensionList);
  return extraout_EAX;
}

Assistant:

void VertexArrayTest::init (void)
{
	const int						renderTargetWidth	= de::min(512, m_renderCtx.getRenderTarget().getWidth());
	const int						renderTargetHeight	= de::min(512, m_renderCtx.getRenderTarget().getHeight());
	sglr::ReferenceContextLimits	limits				(m_renderCtx);

	m_glesContext		= new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));

	m_refBuffers		= new sglr::ReferenceContextBuffers(m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, renderTargetWidth, renderTargetHeight);
	m_refContext		= new sglr::ReferenceContext(limits, m_refBuffers->getColorbuffer(), m_refBuffers->getDepthbuffer(), m_refBuffers->getStencilbuffer());

	m_glArrayPack		= new ContextArrayPack(m_renderCtx, *m_glesContext);
	m_rrArrayPack		= new ContextArrayPack(m_renderCtx, *m_refContext);
}